

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  float fVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ulong uVar7;
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar8;
  ImGuiContext *g;
  int iVar9;
  
  pIVar4 = GImGui;
  if (key == 0) {
    return;
  }
  this->BackendUsingLegacyKeyArrays = '\0';
  iVar5 = key;
  if (key - 0x269U < 0x18) {
    this->BackendUsingLegacyNavInputArray = false;
  }
  else if (((uint)key < 0x200) && (iVar5 = (pIVar4->IO).KeyMap[(uint)key], iVar5 == -1)) {
    iVar5 = key;
  }
  if ((pIVar4->IO).KeysData[iVar5].Down == down) {
    fVar2 = (pIVar4->IO).KeysData[iVar5].AnalogValue;
    if ((fVar2 == analog_value) && (!NAN(fVar2) && !NAN(analog_value))) {
      uVar7 = (ulong)(pIVar4->InputEventsQueue).Size;
      if ((long)uVar7 < 1) {
        return;
      }
      paVar8 = &(pIVar4->InputEventsQueue).Data[uVar7 - 1].field_2;
      do {
        if (((ImGuiInputEvent *)((long)paVar8 + -8))->Type == ImGuiInputEventType_Key) {
          if ((uVar7 < 2) || ((paVar8->MouseButton).Button == key)) goto LAB_00106504;
        }
        else if (uVar7 < 2) {
          return;
        }
        paVar8 = paVar8 + -2;
        uVar7 = uVar7 - 1;
      } while( true );
    }
  }
LAB_0010650d:
  iVar5 = (pIVar4->InputEventsQueue).Size;
  if (iVar5 == (pIVar4->InputEventsQueue).Capacity) {
    if (iVar5 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    piVar1 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar9 * 0x18,GImAllocatorUserData);
    pIVar3 = (pIVar4->InputEventsQueue).Data;
    if (pIVar3 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest,pIVar3,(long)(pIVar4->InputEventsQueue).Size * 0x18);
      pIVar3 = (pIVar4->InputEventsQueue).Data;
      if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (pIVar4->InputEventsQueue).Data = __dest;
    (pIVar4->InputEventsQueue).Capacity = iVar9;
    iVar5 = (pIVar4->InputEventsQueue).Size;
  }
  else {
    __dest = (pIVar4->InputEventsQueue).Data;
  }
  __dest[iVar5].Type = ImGuiInputEventType_Key;
  __dest[iVar5].Source = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
  __dest[iVar5].field_2.Key.Key = key;
  __dest[iVar5].field_2.MouseButton.Down = down;
  *(undefined2 *)((long)&__dest[iVar5].field_2 + 5) = 0;
  *(undefined1 *)((long)&__dest[iVar5].field_2 + 7) = 0;
  __dest[iVar5].field_2.Key.AnalogValue = analog_value;
  *(undefined4 *)&__dest[iVar5].AddedByTestEngine = 0;
  (pIVar4->InputEventsQueue).Size = (pIVar4->InputEventsQueue).Size + 1;
  return;
LAB_00106504:
  if ((paVar8->MouseButton).Button != key) {
    return;
  }
  goto LAB_0010650d;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}